

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

bc_slist_t * blogc_source_parse_from_files(bc_trie_t *conf,bc_slist_t *l,bc_error_t **err)

{
  bc_trie_t *pbVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  bc_error_t *pbVar5;
  bc_slist_t *pbVar6;
  bc_slist_t *pbVar7;
  char **strv;
  ulong uVar8;
  size_t sVar9;
  code *cmp;
  float fVar10;
  float local_184;
  char *local_160;
  char *local_158;
  size_t last_page;
  char *val_1;
  char *val;
  bc_trie_t *s_2;
  bc_slist_t *tmp_4;
  long lStack_118;
  _Bool first;
  size_t i;
  _Bool found;
  char **tags;
  char *tags_str;
  bc_trie_t *s_1;
  bc_slist_t *tmp_3;
  bc_slist_t *rv;
  size_t counter;
  size_t end;
  size_t start;
  long per_page;
  long page;
  char *endptr;
  char *ptr;
  char *filter_per_page;
  char *filter_page;
  char *filter_tag;
  bc_slist_t *tmp_1;
  bc_slist_t *tmp_2;
  bc_slist_t *tmp_sources;
  char *pcStack_70;
  _Bool reverse;
  char *timestamp;
  char *date;
  bc_trie_t *s;
  char *f;
  bc_slist_t *tmp;
  size_t with_date;
  bc_error_t *tmp_err;
  bc_slist_t *sources;
  bc_error_t **ppbStack_28;
  _Bool sort;
  bc_error_t **err_local;
  bc_slist_t *l_local;
  bc_trie_t *conf_local;
  
  if ((err == (bc_error_t **)0x0) || (*err != (bc_error_t *)0x0)) {
    conf_local = (bc_trie_t *)0x0;
  }
  else {
    ppbStack_28 = err;
    err_local = (bc_error_t **)l;
    l_local = (bc_slist_t *)conf;
    pcVar4 = (char *)bc_trie_lookup(conf,"FILTER_SORT");
    sources._7_1_ = bc_str_to_bool(pcVar4);
    tmp_err = (bc_error_t *)0x0;
    with_date = 0;
    tmp = (bc_slist_t *)0x0;
    for (f = (char *)err_local; pbVar7 = tmp, f != (char *)0x0; f = *(char **)f) {
      s = *(bc_trie_t **)(f + 8);
      date = (char *)blogc_source_parse_from_file
                               ((bc_trie_t *)l_local,(char *)s,(bc_error_t **)&with_date);
      if ((bc_trie_t *)date == (bc_trie_t *)0x0) {
        pbVar5 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                     "An error occurred while parsing source file: %s\n\n%s",s,
                                     *(undefined8 *)with_date);
        *ppbStack_28 = pbVar5;
        bc_error_free((bc_error_t *)with_date);
        bc_slist_free_full((bc_slist_t *)tmp_err,bc_trie_free);
        return (bc_slist_t *)0x0;
      }
      timestamp = (char *)bc_trie_lookup((bc_trie_t *)date,"DATE");
      if (timestamp != (char *)0x0) {
        tmp = (bc_slist_t *)((long)&tmp->next + 1);
      }
      if ((sources._7_1_ & 1) != 0) {
        if (timestamp == (char *)0x0) {
          pbVar5 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                       "\'FILTER_SORT\' requires that \'DATE\' variable is set for every source file: %s"
                                       ,s);
          *ppbStack_28 = pbVar5;
          bc_trie_free((bc_trie_t *)date);
          bc_slist_free_full((bc_slist_t *)tmp_err,bc_trie_free);
          return (bc_slist_t *)0x0;
        }
        pcStack_70 = blogc_convert_datetime(timestamp,"%s",(bc_error_t **)&with_date);
        if (pcStack_70 == (char *)0x0) {
          pbVar5 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                       "An error occurred while parsing \'DATE\' variable: %s\n\n%s"
                                       ,s,*(undefined8 *)with_date);
          *ppbStack_28 = pbVar5;
          bc_error_free((bc_error_t *)with_date);
          bc_trie_free((bc_trie_t *)date);
          bc_slist_free_full((bc_slist_t *)tmp_err,bc_trie_free);
          return (bc_slist_t *)0x0;
        }
        bc_trie_insert((bc_trie_t *)date,"c",pcStack_70);
      }
      tmp_err = (bc_error_t *)bc_slist_append((bc_slist_t *)tmp_err,date);
    }
    if ((tmp == (bc_slist_t *)0x0) ||
       (pbVar6 = (bc_slist_t *)bc_slist_length((bc_slist_t *)err_local), pbVar6 <= pbVar7)) {
      pcVar4 = (char *)bc_trie_lookup((bc_trie_t *)l_local,"FILTER_REVERSE");
      tmp_sources._7_1_ = bc_str_to_bool(pcVar4);
      if ((sources._7_1_ & 1) == 0) {
        if ((bool)tmp_sources._7_1_) {
          tmp_2 = (bc_slist_t *)0x0;
          for (tmp_1 = (bc_slist_t *)tmp_err; pbVar5 = tmp_err, tmp_1 != (bc_slist_t *)0x0;
              tmp_1 = tmp_1->next) {
            tmp_2 = bc_slist_prepend(tmp_2,tmp_1->data);
          }
          filter_tag = (char *)tmp_err;
          tmp_err = (bc_error_t *)tmp_2;
          bc_slist_free((bc_slist_t *)pbVar5);
        }
      }
      else {
        cmp = sort_source;
        if ((bool)tmp_sources._7_1_) {
          cmp = sort_source_reverse;
        }
        tmp_err = (bc_error_t *)bc_slist_sort((bc_slist_t *)tmp_err,cmp);
      }
      filter_page = (char *)bc_trie_lookup((bc_trie_t *)l_local,"FILTER_TAG");
      filter_per_page = (char *)bc_trie_lookup((bc_trie_t *)l_local,"FILTER_PAGE");
      ptr = (char *)bc_trie_lookup((bc_trie_t *)l_local,"FILTER_PER_PAGE");
      if (filter_per_page == (char *)0x0) {
        local_158 = "";
      }
      else {
        local_158 = filter_per_page;
      }
      endptr = local_158;
      per_page = strtol(local_158,(char **)&page,10);
      if ((*endptr != '\0') && (*(char *)page != '\0')) {
        fprintf(_stderr,
                "warning: invalid value for \'FILTER_PAGE\' variable: %s. using %ld instead\n",
                endptr,per_page);
      }
      if (per_page < 1) {
        per_page = 1;
      }
      if (ptr == (char *)0x0) {
        local_160 = "10";
      }
      else {
        local_160 = ptr;
      }
      endptr = local_160;
      start = strtol(local_160,(char **)&page,10);
      if ((*endptr != '\0') && (*(char *)page != '\0')) {
        fprintf(_stderr,
                "warning: invalid value for \'FILTER_PER_PAGE\' variable: %s. using %ld instead\n",
                endptr,start);
      }
      if ((long)start < 0) {
        start = 0;
      }
      pbVar7 = (bc_slist_t *)((per_page + -1) * start);
      rv = (bc_slist_t *)0x0;
      tmp_3 = (bc_slist_t *)0x0;
      for (s_1 = (bc_trie_t *)tmp_err; s_1 != (bc_trie_t *)0x0; s_1 = (bc_trie_t *)s_1->root) {
        pbVar1 = (bc_trie_t *)s_1->free_func;
        if (filter_page == (char *)0x0) {
LAB_00102d5a:
          if (filter_per_page != (char *)0x0) {
            if ((rv < pbVar7) || ((bc_slist_t *)((long)&pbVar7->next + start) <= rv)) {
              rv = (bc_slist_t *)((long)&rv->next + 1);
              bc_trie_free(pbVar1);
              goto LAB_00102dd0;
            }
            rv = (bc_slist_t *)((long)&rv->next + 1);
          }
          tmp_3 = bc_slist_append(tmp_3,pbVar1);
        }
        else {
          pcVar4 = (char *)bc_trie_lookup(pbVar1,"TAGS");
          if (pcVar4 == (char *)0x0) {
            bc_trie_free(pbVar1);
          }
          else {
            strv = bc_str_split(pcVar4,' ',0);
            bVar2 = false;
            for (lStack_118 = 0; strv[lStack_118] != (char *)0x0; lStack_118 = lStack_118 + 1) {
              if ((*strv[lStack_118] != '\0') &&
                 (iVar3 = strcmp(strv[lStack_118],filter_page), iVar3 == 0)) {
                bVar2 = true;
              }
            }
            bc_strv_free(strv);
            if (bVar2) goto LAB_00102d5a;
            bc_trie_free(pbVar1);
          }
        }
LAB_00102dd0:
      }
      bc_slist_free((bc_slist_t *)tmp_err);
      bVar2 = true;
      for (s_2 = (bc_trie_t *)tmp_3; s_2 != (bc_trie_t *)0x0; s_2 = (bc_trie_t *)s_2->root) {
        pbVar1 = (bc_trie_t *)s_2->free_func;
        if (bVar2) {
          pcVar4 = (char *)bc_trie_lookup(pbVar1,"DATE");
          pbVar7 = l_local;
          if (pcVar4 != (char *)0x0) {
            pcVar4 = bc_strdup(pcVar4);
            bc_trie_insert((bc_trie_t *)pbVar7,"DATE_FIRST",pcVar4);
          }
          pcVar4 = (char *)bc_trie_lookup(pbVar1,"FILENAME");
          pbVar7 = l_local;
          if (pcVar4 != (char *)0x0) {
            pcVar4 = bc_strdup(pcVar4);
            bc_trie_insert((bc_trie_t *)pbVar7,"FILENAME_FIRST",pcVar4);
          }
          bVar2 = false;
        }
        if (s_2->root == (bc_trie_node_t *)0x0) {
          pcVar4 = (char *)bc_trie_lookup(pbVar1,"DATE");
          pbVar7 = l_local;
          if (pcVar4 != (char *)0x0) {
            pcVar4 = bc_strdup(pcVar4);
            bc_trie_insert((bc_trie_t *)pbVar7,"DATE_LAST",pcVar4);
          }
          pcVar4 = (char *)bc_trie_lookup(pbVar1,"FILENAME");
          pbVar7 = l_local;
          if (pcVar4 != (char *)0x0) {
            pcVar4 = bc_strdup(pcVar4);
            bc_trie_insert((bc_trie_t *)pbVar7,"FILENAME_LAST",pcVar4);
          }
        }
      }
      if (filter_per_page != (char *)0x0) {
        local_184 = (float)rv;
        fVar10 = ceilf(local_184 / (float)(long)start);
        pbVar7 = l_local;
        uVar8 = (long)fVar10 | (long)(fVar10 - 9.223372e+18) & (long)fVar10 >> 0x3f;
        pcVar4 = bc_strdup_printf("%ld",per_page);
        bc_trie_insert((bc_trie_t *)pbVar7,"CURRENT_PAGE",pcVar4);
        pbVar7 = l_local;
        if (1 < per_page) {
          pcVar4 = bc_strdup_printf("%ld",per_page + -1);
          bc_trie_insert((bc_trie_t *)pbVar7,"PREVIOUS_PAGE",pcVar4);
        }
        pbVar7 = l_local;
        if ((ulong)per_page < uVar8) {
          pcVar4 = bc_strdup_printf("%ld",per_page + 1);
          bc_trie_insert((bc_trie_t *)pbVar7,"NEXT_PAGE",pcVar4);
        }
        sVar9 = bc_slist_length(tmp_3);
        pbVar7 = l_local;
        if (sVar9 != 0) {
          pcVar4 = bc_strdup("1");
          bc_trie_insert((bc_trie_t *)pbVar7,"FIRST_PAGE",pcVar4);
        }
        pbVar7 = l_local;
        if (uVar8 != 0) {
          pcVar4 = bc_strdup_printf("%d",uVar8);
          bc_trie_insert((bc_trie_t *)pbVar7,"LAST_PAGE",pcVar4);
        }
      }
      conf_local = (bc_trie_t *)tmp_3;
    }
    else {
      pbVar5 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                   "\'DATE\' variable provided for at least one source file, but not for all source files. It must be provided for all files."
                                  );
      *ppbStack_28 = pbVar5;
      bc_slist_free_full((bc_slist_t *)tmp_err,bc_trie_free);
      conf_local = (bc_trie_t *)0x0;
    }
  }
  return (bc_slist_t *)conf_local;
}

Assistant:

bc_slist_t*
blogc_source_parse_from_files(bc_trie_t *conf, bc_slist_t *l, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    bool sort = bc_str_to_bool(bc_trie_lookup(conf, "FILTER_SORT"));

    bc_slist_t* sources = NULL;
    bc_error_t *tmp_err = NULL;
    size_t with_date = 0;
    for (bc_slist_t *tmp = l; tmp != NULL; tmp = tmp->next) {
        char *f = tmp->data;
        bc_trie_t *s = blogc_source_parse_from_file(conf, f, &tmp_err);
        if (s == NULL) {
            *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
                "An error occurred while parsing source file: %s\n\n%s",
                f, tmp_err->msg);
            bc_error_free(tmp_err);
            bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
            return NULL;
        }

        const char *date = bc_trie_lookup(s, "DATE");
        if (date != NULL) {
            with_date++;
        }

        if (sort) {
            if (date == NULL) {
                *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
                    "'FILTER_SORT' requires that 'DATE' variable is set for "
                    "every source file: %s", f);
                bc_trie_free(s);
                bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
                return NULL;
            }

            char *timestamp = blogc_convert_datetime(date, "%s", &tmp_err);
            if (timestamp == NULL) {
                *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
                    "An error occurred while parsing 'DATE' variable: %s"
                    "\n\n%s", f, tmp_err->msg);
                bc_error_free(tmp_err);
                bc_trie_free(s);
                bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
                return NULL;
            }

            bc_trie_insert(s, "c", timestamp);
        }

        sources = bc_slist_append(sources, s);
    }

    if (with_date > 0 && with_date < bc_slist_length(l)) {
        *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
            "'DATE' variable provided for at least one source file, but not "
            "for all source files. It must be provided for all files.");
        bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
        return NULL;
    }

    bool reverse = bc_str_to_bool(bc_trie_lookup(conf, "FILTER_REVERSE"));

    if (sort) {
        sources = bc_slist_sort(sources,
            (bc_sort_func_t) (reverse ? sort_source_reverse : sort_source));
    }
    else if (reverse) {
        bc_slist_t *tmp_sources = NULL;
        for (bc_slist_t *tmp = sources; tmp != NULL; tmp = tmp->next) {
            tmp_sources = bc_slist_prepend(tmp_sources, tmp->data);
        }
        bc_slist_t *tmp = sources;
        sources = tmp_sources;
        bc_slist_free(tmp);
    }

    const char *filter_tag = bc_trie_lookup(conf, "FILTER_TAG");
    const char *filter_page = bc_trie_lookup(conf, "FILTER_PAGE");
    const char *filter_per_page = bc_trie_lookup(conf, "FILTER_PER_PAGE");

    const char *ptr;
    char *endptr;

    ptr = filter_page != NULL ? filter_page : "";
    long page = strtol(ptr, &endptr, 10);
    if (*ptr != '\0' && *endptr != '\0')
        fprintf(stderr, "warning: invalid value for 'FILTER_PAGE' variable: "
            "%s. using %ld instead\n", ptr, page);
    if (page <= 0)
        page = 1;

    ptr = filter_per_page != NULL ? filter_per_page : "10";
    long per_page = strtol(ptr, &endptr, 10);
    if (*ptr != '\0' && *endptr != '\0')
        fprintf(stderr, "warning: invalid value for 'FILTER_PER_PAGE' variable: "
            "%s. using %ld instead\n", ptr, per_page);
    if (per_page < 0)
        per_page = 0;

    // poor man's pagination
    size_t start = (page - 1) * per_page;
    size_t end = start + per_page;
    size_t counter = 0;

    bc_slist_t *rv = NULL;
    for (bc_slist_t *tmp = sources; tmp != NULL; tmp = tmp->next) {
        bc_trie_t *s = tmp->data;
        if (filter_tag != NULL) {
            const char *tags_str = bc_trie_lookup(s, "TAGS");
            // if user wants to filter by tag and no tag is provided, skip it
            if (tags_str == NULL) {
                bc_trie_free(s);
                continue;
            }
            char **tags = bc_str_split(tags_str, ' ', 0);
            bool found = false;
            for (size_t i = 0; tags[i] != NULL; i++) {
                if (tags[i][0] == '\0')
                    continue;
                if (0 == strcmp(tags[i], filter_tag))
                    found = true;
            }
            bc_strv_free(tags);
            if (!found) {
                bc_trie_free(s);
                continue;
            }
        }
        if (filter_page != NULL) {
            if (counter < start || counter >= end) {
                counter++;
                bc_trie_free(s);
                continue;
            }
            counter++;
        }
        rv = bc_slist_append(rv, s);
    }

    bc_slist_free(sources);

    bool first = true;
    for (bc_slist_t *tmp = rv; tmp != NULL; tmp = tmp->next) {
        bc_trie_t *s = tmp->data;
        if (first) {
            const char *val = bc_trie_lookup(s, "DATE");
            if (val != NULL)
                bc_trie_insert(conf, "DATE_FIRST", bc_strdup(val));
            val = bc_trie_lookup(s, "FILENAME");
            if (val != NULL)
                bc_trie_insert(conf, "FILENAME_FIRST", bc_strdup(val));
            first = false;
        }
        if (tmp->next == NULL) {  // last
            const char *val = bc_trie_lookup(s, "DATE");
            if (val != NULL)
                bc_trie_insert(conf, "DATE_LAST", bc_strdup(val));
            val = bc_trie_lookup(s, "FILENAME");
            if (val != NULL)
                bc_trie_insert(conf, "FILENAME_LAST", bc_strdup(val));
        }
    }

    if (filter_page != NULL) {
        size_t last_page = ceilf(((float) counter) / per_page);
        bc_trie_insert(conf, "CURRENT_PAGE", bc_strdup_printf("%ld", page));
        if (page > 1)
            bc_trie_insert(conf, "PREVIOUS_PAGE", bc_strdup_printf("%ld", page - 1));
        if (page < last_page)
            bc_trie_insert(conf, "NEXT_PAGE", bc_strdup_printf("%ld", page + 1));
        if (bc_slist_length(rv) > 0)
            bc_trie_insert(conf, "FIRST_PAGE", bc_strdup("1"));
        if (last_page > 0)
            bc_trie_insert(conf, "LAST_PAGE", bc_strdup_printf("%d", last_page));
    }

    return rv;
}